

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::ModportSimplePortListSyntax::getChild
          (TokenOrSyntax *__return_storage_ptr__,ModportSimplePortListSyntax *this,size_t index)

{
  Token token;
  SyntaxNode *local_60;
  SyntaxNode *local_50;
  size_t index_local;
  ModportSimplePortListSyntax *this_local;
  
  if (index == 0) {
    local_50 = (SyntaxNode *)0x0;
    if (this != (ModportSimplePortListSyntax *)0xfffffffffffffff0) {
      local_50 = &(this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode;
    }
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,local_50);
  }
  else if (index == 1) {
    token.kind = (this->direction).kind;
    token._2_1_ = (this->direction).field_0x2;
    token.numFlags.raw = (this->direction).numFlags.raw;
    token.rawLen = (this->direction).rawLen;
    token.info = (this->direction).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token);
  }
  else if (index == 2) {
    local_60 = (SyntaxNode *)0x0;
    if (this != (ModportSimplePortListSyntax *)0xffffffffffffffb0) {
      local_60 = &(this->ports).super_SyntaxListBase.super_SyntaxNode;
    }
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,local_60);
  }
  else {
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

TokenOrSyntax ModportSimplePortListSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return &attributes;
        case 1: return direction;
        case 2: return &ports;
        default: return nullptr;
    }
}